

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::CopyFrom
          (ImageFeatureType_ImageSizeRange *this,ImageFeatureType_ImageSizeRange *from)

{
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void ImageFeatureType_ImageSizeRange::CopyFrom(const ImageFeatureType_ImageSizeRange& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}